

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasinterval.cpp
# Opt level: O2

void __thiscall LASinterval::merge_intervals(LASinterval *this,U32 maximum_intervals)

{
  uint *puVar1;
  uint uVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  int *piVar5;
  _Base_ptr p_Var6;
  int iVar7;
  _Rb_tree_color _Var8;
  int *piVar9;
  _Self __tmp;
  long *plVar10;
  ulong uVar11;
  size_t sVar12;
  pair<const_unsigned_int,_LASintervalCell_*> local_70;
  my_cell_map map;
  
  _Var8 = _S_red;
  puVar1 = (uint *)((long)this->cells + 0x18);
  uVar11 = (ulong)(maximum_intervals - *puVar1);
  if (maximum_intervals < *puVar1) {
    uVar11 = 0;
  }
  map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &map._M_t._M_impl.super__Rb_tree_header._M_header;
  map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  plVar10 = (long *)((long)this->cells + 0x10);
  map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (plVar10 = (long *)*plVar10, plVar10 != (long *)0x0) {
    p_Var6 = (_Base_ptr)(plVar10 + 1);
    while( true ) {
      p_Var6 = p_Var6->_M_parent;
      if (p_Var6->_M_parent == (_Base_ptr)0x0) break;
      _Var8 = ~*(uint *)&p_Var6->field_0x4 + p_Var6->_M_parent->_M_color;
      local_70.first = _Var8;
      local_70.second = (LASintervalCell *)p_Var6;
      std::
      _Rb_tree<unsigned_int,std::pair<unsigned_int_const,LASintervalCell*>,std::_Select1st<std::pair<unsigned_int_const,LASintervalCell*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,LASintervalCell*>>>
      ::_M_insert_equal<std::pair<unsigned_int_const,LASintervalCell*>>
                ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,LASintervalCell*>,std::_Select1st<std::pair<unsigned_int_const,LASintervalCell*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,LASintervalCell*>>>
                  *)&map,&local_70);
    }
  }
  if (uVar11 < map._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    sVar12 = map._M_t._M_impl.super__Rb_tree_header._M_node_count;
    while( true ) {
      if ((uint)sVar12 <= (uint)uVar11) break;
      _Var8 = map._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_color;
      p_Var6 = map._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_parent;
      std::
      _Rb_tree<unsigned_int,std::pair<unsigned_int_const,LASintervalCell*>,std::_Select1st<std::pair<unsigned_int_const,LASintervalCell*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,LASintervalCell*>>>
      ::erase_abi_cxx11_((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,LASintervalCell*>,std::_Select1st<std::pair<unsigned_int_const,LASintervalCell*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,LASintervalCell*>>>
                          *)&map,(iterator)map._M_t._M_impl.super__Rb_tree_header._M_header._M_left)
      ;
      if ((p_Var6->_M_color == _S_black) && (*(int *)&p_Var6->field_0x4 == 0)) {
        this->number_intervals = this->number_intervals - 1;
        operator_delete(p_Var6);
      }
      else {
        p_Var3 = p_Var6->_M_parent;
        uVar2 = *(uint *)&p_Var3->field_0x4;
        *(uint *)&p_Var6->field_0x4 = uVar2;
        p_Var4 = p_Var3->_M_parent;
        p_Var6->_M_parent = p_Var4;
        if (p_Var4 == (_Base_ptr)0x0) {
          this->number_intervals = this->number_intervals - 1;
          operator_delete(p_Var3);
        }
        else {
          local_70.first = ~uVar2 + p_Var4->_M_color;
          local_70.second = (LASintervalCell *)p_Var6;
          std::
          _Rb_tree<unsigned_int,std::pair<unsigned_int_const,LASintervalCell*>,std::_Select1st<std::pair<unsigned_int_const,LASintervalCell*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,LASintervalCell*>>>
          ::_M_insert_equal<std::pair<unsigned_int_const,LASintervalCell*>>
                    ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,LASintervalCell*>,std::_Select1st<std::pair<unsigned_int_const,LASintervalCell*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,LASintervalCell*>>>
                      *)&map,&local_70);
          *(undefined8 *)p_Var3 = 1;
        }
        sVar12 = (size_t)((uint)sVar12 - 1);
      }
    }
    for (p_Var6 = map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != &map._M_t._M_impl.super__Rb_tree_header;
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
      p_Var3 = p_Var6[1]._M_parent;
      if ((p_Var3->_M_color == _S_black) && (*(int *)&p_Var3->field_0x4 == 0)) {
        this->number_intervals = this->number_intervals - 1;
        operator_delete(p_Var3);
      }
    }
    LASMessage(LAS_VERBOSE,"largest interval gap increased to %u",(ulong)_Var8);
    plVar10 = (long *)((long)this->cells + 0x10);
    while (plVar10 = (long *)*plVar10, plVar10 != (long *)0x0) {
      piVar5 = (int *)plVar10[2];
      piVar5[5] = 0;
      iVar7 = 0;
      for (piVar9 = piVar5; piVar9 != (int *)0x0; piVar9 = *(int **)(piVar9 + 2)) {
        iVar7 = iVar7 + (piVar9[1] - *piVar9) + 1;
        piVar5[5] = iVar7;
      }
    }
  }
  else if (map._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    LASMessage(LAS_VERBOSE,"maximum_intervals: %u number of interval gaps: 0 ",uVar11);
  }
  else {
    LASMessage(LAS_VERBOSE,
               "maximum_intervals: %u number of interval gaps: %u next largest interval gap %u",
               uVar11,map._M_t._M_impl.super__Rb_tree_header._M_node_count & 0xffffffff,
               (ulong)map._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_color);
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_LASintervalCell_*>,_std::_Select1st<std::pair<const_unsigned_int,_LASintervalCell_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_LASintervalCell_*>_>_>
  ::~_Rb_tree(&map._M_t);
  return;
}

Assistant:

void LASinterval::merge_intervals(U32 maximum_intervals)
{
  U32 diff = 0;
  LASintervalCell* cell;
  LASintervalCell* delete_cell;

  // each cell has minimum one interval

  if (maximum_intervals < get_number_cells())
  {
    maximum_intervals = 0;
  }
  else
  {
    maximum_intervals -= get_number_cells();
  }

  // order intervals by smallest gap

  my_cell_map map;
  my_cell_hash::iterator hash_element = ((my_cell_hash*)cells)->begin();
  while (hash_element != ((my_cell_hash*)cells)->end())
  {
    cell = (*hash_element).second;
    while (cell->next)
    {
      diff = cell->next->start - cell->end - 1;
      map.insert(my_cell_map::value_type(diff, cell));
      cell = cell->next;
    }
    hash_element++;
  }

  // maybe nothing to do
  if (map.size() <= maximum_intervals)
  {
    if (map.size() == 0)
    {
      LASMessage(LAS_VERBOSE, "maximum_intervals: %u number of interval gaps: 0 ", maximum_intervals);
    }
    else
    {
      diff = (*(map.begin())).first;
      LASMessage(LAS_VERBOSE,"maximum_intervals: %u number of interval gaps: %u next largest interval gap %u", maximum_intervals, (U32)map.size(), diff);
    }
    return;
  }

  my_cell_map::iterator map_element;
  U32 size = (U32)map.size();

  while (size > maximum_intervals)
  {
    map_element = map.begin();
    diff = (*map_element).first;
    cell = (*map_element).second;
    map.erase(map_element);
    if ((cell->start == 1) && (cell->end == 0)) // the (start == 1 && end == 0) signals that the cell is to be deleted
    {
      number_intervals--;
      delete cell;
    }
    else
    {
#pragma warning(push)
#pragma warning(disable : 28182)
      delete_cell = cell->next;
      cell->end = delete_cell->end;
      cell->next = delete_cell->next;
#pragma warning(pop)
      if (cell->next)
      {
        map.insert(my_cell_map::value_type(cell->next->start - cell->end - 1, cell));
        delete_cell->start = 1; delete_cell->end = 0; // the (start == 1 && end == 0) signals that the cell is to be deleted
      }
      else
      {
        number_intervals--;
        delete delete_cell;
      }
      size--;
    }
  }
  map_element = map.begin();
  while (true)
  {
    if (map_element == map.end()) break;
    cell = (*map_element).second;
    if ((cell->start == 1) && (cell->end == 0)) // the (start == 1 && end == 0) signals that the cell is to be deleted
    {
      number_intervals--;
      delete cell;
    }
    map_element++;
  }
  LASMessage(LAS_VERBOSE, "largest interval gap increased to %u", diff);

  // update totals

  LASintervalStartCell* start_cell;
  hash_element = ((my_cell_hash*)cells)->begin();
  while (hash_element != ((my_cell_hash*)cells)->end())
  {
    start_cell = (*hash_element).second;
    start_cell->total = 0;
    cell = start_cell;
    while (cell)
    {
      start_cell->total += (cell->end - cell->start + 1);
      cell = cell->next;
    }
    hash_element++;
  }
}